

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::skip_group(CVmPackPos *p,wchar_t close_paren)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  int __c;
  wchar_t wVar4;
  char *in_RSI;
  CVmPackPos *in_RDI;
  wchar_t c;
  int depth;
  int iVar5;
  
  wVar4 = (wchar_t)in_RSI;
  iVar5 = 1;
  CVmPackPos::inc((CVmPackPos *)CONCAT44(wVar4,1));
  while (iVar1 = CVmPackPos::more((CVmPackPos *)CONCAT44(wVar4,iVar5)), iVar1 != 0) {
    wVar2 = CVmPackPos::getch((CVmPackPos *)CONCAT44(wVar4,iVar5));
    if (wVar2 == L'(') {
LAB_0037a130:
      iVar5 = iVar5 + 1;
    }
    else if (wVar2 == L')') {
LAB_0037a13d:
      iVar5 = iVar5 + -1;
    }
    else {
      if (wVar2 == L'[') goto LAB_0037a130;
      if (wVar2 == L']') goto LAB_0037a13d;
      if (wVar2 == L'{') goto LAB_0037a130;
      if (wVar2 == L'}') goto LAB_0037a13d;
    }
    if ((wVar2 == wVar4) && (iVar5 == 0)) break;
    CVmPackPos::inc((CVmPackPos *)CONCAT44(wVar4,iVar5));
  }
  iVar5 = CVmPackPos::more((CVmPackPos *)CONCAT44(wVar4,iVar5));
  if (iVar5 != 0) {
    return;
  }
  pcVar3 = CVmPackPos::index(in_RDI,in_RSI,__c);
  err_throw_a(0x6b,1,0,(ulong)pcVar3 & 0xffffffff);
}

Assistant:

void CVmPack::skip_group(CVmPackPos *p, wchar_t close_paren)
{
    /* scan ahead to the matching close paren */
    int depth = 1;
    for (p->inc() ; p->more() ; p->inc())
    {
        /* note any further nesting */
        wchar_t c = p->getch();
        switch (c)
        {
        case '(':
        case '[':
        case '{':
            depth++;
            break;

        case ')':
        case ']':
        case '}':
            depth--;
            break;
        }

        /* 
         *   if this is our close paren, and we're not in nested parens or
         *   other brackets, we're done 
         */
        if (c == close_paren && depth == 0)
            break;
    }

    /* make sure we found the matching close paren */
    if (!p->more())
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());
}